

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O0

bool QChar::isSpace_helper(char32_t ucs4)

{
  Properties *pPVar1;
  char32_t in_EDI;
  int test;
  undefined1 local_1;
  
  if ((uint)in_EDI < 0x110000) {
    pPVar1 = QUnicodeTables::qGetProp(in_EDI);
    local_1 = (1 << ((byte)*(undefined8 *)pPVar1 & 0x1f) & 0x1c0U) != 0;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QT_FASTCALL QChar::isSpace_helper(char32_t ucs4) noexcept
{
    if (ucs4 > LastValidCodePoint)
        return false;
    const int test = FLAG(Separator_Space) |
                     FLAG(Separator_Line) |
                     FLAG(Separator_Paragraph);
    return FLAG(qGetProp(ucs4)->category) & test;
}